

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_buglist(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  MYSQL *pMVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  char *pcVar11;
  char str [200];
  char query [4608];
  char arg1 [4608];
  char arg2 [4608];
  
  if (*argument == '\0') {
    send_to_char("Syntax:  buglist <number>                          - detailed information about bug <number>\n\r"
                 ,ch);
    send_to_char("         buglist last <number>                     - list <number> most recent bugs\n\r"
                 ,ch);
    send_to_char("         buglist add <brief one line summary>      - report bug (it prompts for detailed description)\n\r"
                 ,ch);
    pcVar11 = 
    "         buglist done <number>                     - mark bug <number> as resolved\n\r";
LAB_002cffec:
    send_to_char(pcVar11,ch);
    return;
  }
  bVar4 = is_npc(ch);
  if (bVar4) {
    pcVar11 = "Die.\n\r";
    goto LAB_002cffec;
  }
  pcVar11 = one_argument(argument,arg1);
  iVar5 = bcmp(arg1,"auto",5);
  if (iVar5 == 0) {
    builtin_strncpy(query + 0x30,"ID desc LIMIT 8",0x10);
    builtin_strncpy(query + 0x20,"us = 0 ORDER BY ",0x10);
    builtin_strncpy(query + 0x10,"glist WHERE Stat",0x10);
    builtin_strncpy(query,"SELECT * from bu",0x10);
    builtin_strncpy(str,"Displaying last 8 unresolved bugs.\n\r",0x25);
LAB_002d01b4:
    pMVar7 = open_conn();
    if (pMVar7 != (MYSQL *)0x0) {
      send_to_char(str,ch);
      mysql_query(pMVar7,query);
      lVar8 = mysql_store_result(pMVar7);
      if (lVar8 == 0) {
        send_to_char("No bugs found.\n\r",ch);
      }
      else {
        send_to_char("ID    Added By    Summary\n\r",ch);
        pcVar11 = "---   ---------   ------------\n\r";
        while( true ) {
          send_to_char(pcVar11,ch);
          puVar10 = (undefined8 *)mysql_fetch_row(lVar8);
          if (puVar10 == (undefined8 *)0x0) break;
          uVar1 = *puVar10;
          uVar2 = puVar10[1];
          uVar3 = puVar10[3];
          iVar5 = atoi((char *)puVar10[5]);
          pcVar11 = "";
          if (iVar5 == 1) {
            pcVar11 = "(SOLVED)";
          }
          sprintf(query,"%-5s %-11s %s %s\n\r",uVar1,uVar2,uVar3,pcVar11);
          pcVar11 = query;
        }
      }
      mysql_free_result(lVar8);
LAB_002d037d:
      mysql_close(pMVar7);
      return;
    }
  }
  else {
    bVar4 = is_number(arg1);
    if (!bVar4) {
      iVar5 = bcmp(arg1,"last",5);
      if (iVar5 != 0) {
        if (arg1._0_4_ == 0x646461) {
          pcVar11 = palloc_string(pcVar11);
          ch->pcdata->temp_str = pcVar11;
          send_to_char("Please enter a description of the bug with as much information as possible:\n\r"
                       ,ch);
          enter_text(ch,buglist_end_fun);
          return;
        }
        iVar5 = bcmp(arg1,"done",5);
        if (iVar5 == 0) {
          one_argument(pcVar11,arg2);
          bVar4 = is_number(arg2);
          if (bVar4) {
            uVar6 = atoi(arg2);
            sprintf(query,"UPDATE buglist SET Status = 1 WHERE ID = %d",(ulong)uVar6);
            one_query(query);
            pcVar11 = "Bug marked as resolved.\n\r";
          }
          else {
            pcVar11 = "Invalid number of bug to complete.\n\r";
          }
        }
        else {
          pcVar11 = "Invalid option.\n\r";
        }
        goto LAB_002d02e7;
      }
      one_argument(pcVar11,arg2);
      bVar4 = is_number(arg2);
      if (!bVar4) {
        pcVar11 = "Invalid number of last bugs to display.\n\r";
        goto LAB_002d02e7;
      }
      uVar6 = atoi(arg2);
      sprintf(query,"SELECT * from buglist ORDER BY ID desc LIMIT %d",(ulong)uVar6);
      uVar6 = atoi(arg2);
      sprintf(str,"Displaying last %d bugs.\n\r",(ulong)uVar6);
      goto LAB_002d01b4;
    }
    pMVar7 = open_conn();
    if (pMVar7 != (MYSQL *)0x0) {
      uVar6 = atoi(arg1);
      sprintf(query,"SELECT * from buglist WHERE ID = %d",(ulong)uVar6);
      uVar6 = atoi(arg1);
      sprintf(str,"Displaying bug #%d:\n\r",(ulong)uVar6);
      send_to_char(str,ch);
      mysql_query(pMVar7,query);
      lVar8 = mysql_store_result(pMVar7);
      pcVar11 = "Unable to find that bug.\n\r";
      if ((lVar8 != 0) && (lVar9 = mysql_fetch_row(lVar8), lVar9 != 0)) {
        uVar1 = *(undefined8 *)(lVar9 + 8);
        uVar2 = *(undefined8 *)(lVar9 + 0x10);
        iVar5 = atoi(*(char **)(lVar9 + 0x28));
        pcVar11 = "Unresolved";
        if (iVar5 == 1) {
          pcVar11 = "Resolved";
        }
        sprintf(query,
                "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r",
                uVar1,uVar2,pcVar11,*(undefined8 *)(lVar9 + 0x18),*(undefined8 *)(lVar9 + 0x20));
        pcVar11 = query;
      }
      send_to_char(pcVar11,ch);
      mysql_free_result(lVar8);
      goto LAB_002d037d;
    }
  }
  pcVar11 = "Error opening bug database.\n\r";
LAB_002d02e7:
  send_to_char(pcVar11,ch);
  return;
}

Assistant:

void do_buglist(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], query[MSL], str[200];
	MYSQL *conn;
	MYSQL_RES *res_set = nullptr;
	MYSQL_ROW row = nullptr;

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  buglist <number>                          - detailed information about bug <number>\n\r", ch);
		send_to_char("         buglist last <number>                     - list <number> most recent bugs\n\r", ch);
		send_to_char("         buglist add <brief one line summary>      - report bug (it prompts for detailed description)\n\r", ch);
		send_to_char("         buglist done <number>                     - mark bug <number> as resolved\n\r", ch);
		return;
	}

	if (is_npc(ch))
	{
		send_to_char("Die.\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	// status 0 = unresolved, 1 = resolved, 2 = my head is on fire
	if (!strcmp(arg1, "auto"))
	{
		sprintf(query, "SELECT * from buglist WHERE Status = 0 ORDER BY ID desc LIMIT 8");
		sprintf(str, "Displaying last 8 unresolved bugs.\n\r");
	}
	else if (is_number(arg1))
	{
		conn = open_conn();

		if (!conn)
		{
			send_to_char("Error opening bug database.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist WHERE ID = %d", atoi(arg1));
		sprintf(str, "Displaying bug #%d:\n\r", atoi(arg1));
		send_to_char(str, ch);

		mysql_query(conn, query);

		res_set = mysql_store_result(conn);

		if (!res_set || !(row = mysql_fetch_row(res_set)))
			send_to_char("Unable to find that bug.\n\r", ch);
		else
		{
			sprintf(query, "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r",
				row[1],
				row[2],
				atoi(row[5]) == 1 ? "Resolved" : "Unresolved",
				row[3],
				row[4]);
			send_to_char(query, ch);
		}

		mysql_free_result(res_set);
		mysql_close(conn);
		return;
	}
	else if (!strcmp(arg1, "last"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of last bugs to display.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist ORDER BY ID desc LIMIT %d", atoi(arg2));
		sprintf(str, "Displaying last %d bugs.\n\r", atoi(arg2));
	}
	else if (!strcmp(arg1, "add"))
	{
		ch->pcdata->temp_str = palloc_string(argument);

		send_to_char("Please enter a description of the bug with as much information as possible:\n\r", ch);
		enter_text(ch, buglist_end_fun);
		return;
	}
	else if (!strcmp(arg1, "done"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of bug to complete.\n\r", ch);
			return;
		}

		sprintf(query, "UPDATE buglist SET Status = 1 WHERE ID = %d", atoi(arg2));
		one_query(query);

		send_to_char("Bug marked as resolved.\n\r", ch);

		return;
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	conn = open_conn();

	if (!conn)
	{
		send_to_char("Error opening bug database.\n\r", ch);
		return;
	}

	send_to_char(str, ch);
	mysql_query(conn, query);

	res_set = mysql_store_result(conn);

	if (!res_set)
	{
		send_to_char("No bugs found.\n\r", ch);
	}
	else
	{
		send_to_char("ID    Added By    Summary\n\r", ch);
		send_to_char("---   ---------   ------------\n\r", ch);

		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(query, "%-5s %-11s %s %s\n\r", row[0], row[1], row[3], atoi(row[5]) == 1 ? "(SOLVED)" : "");
			send_to_char(query, ch);
		}
	}

	mysql_free_result(res_set);
	mysql_close(conn);
}